

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timBox.c
# Opt level: O2

float * Tim_ManBoxDelayTable(Tim_Man_t *p,int iBox)

{
  Tim_Box_t *pTVar1;
  float *pfVar2;
  
  pTVar1 = Tim_ManBox(p,iBox);
  if (pTVar1->iDelayTable < 0) {
    pfVar2 = (float *)0x0;
  }
  else {
    pfVar2 = (float *)Vec_PtrEntry(p->vDelayTables,pTVar1->iDelayTable);
    if (pTVar1->nInputs != (int)pfVar2[1]) {
      __assert_fail("(int)pTable[1] == pBox->nInputs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timBox.c"
                    ,0xf2,"float *Tim_ManBoxDelayTable(Tim_Man_t *, int)");
    }
    if (pTVar1->nOutputs != (int)pfVar2[2]) {
      __assert_fail("(int)pTable[2] == pBox->nOutputs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timBox.c"
                    ,0xf3,"float *Tim_ManBoxDelayTable(Tim_Man_t *, int)");
    }
  }
  return pfVar2;
}

Assistant:

float * Tim_ManBoxDelayTable( Tim_Man_t * p, int iBox )
{
    float * pTable;
    Tim_Box_t * pBox = Tim_ManBox(p, iBox);
    if ( pBox->iDelayTable < 0 )
        return NULL;
    pTable = (float *)Vec_PtrEntry( p->vDelayTables, pBox->iDelayTable );
    assert( (int)pTable[1] == pBox->nInputs );
    assert( (int)pTable[2] == pBox->nOutputs );
    return pTable;
}